

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarClassic.cpp
# Opt level: O0

bool __thiscall
GMAA_MAAstarClassic::ConstructAndValuateNextPolicies
          (GMAA_MAAstarClassic *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  type pPVar4;
  type pPVar5;
  size_t sVar6;
  size_t sVar7;
  long *plVar8;
  ulong uVar9;
  undefined4 extraout_var;
  LIndex i_00;
  reference pvVar10;
  ostream *poVar11;
  void *pvVar12;
  type pPVar13;
  type pPVar14;
  type pPVar15;
  undefined1 *in_RCX;
  shared_ptr<PartialPolicyPoolInterface> *in_RDX;
  shared_ptr<PartialPolicyPoolItemInterface> *in_RSI;
  PlanningUnit *in_RDI;
  double dVar16;
  double dVar17;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  PJPDP_sharedPtr jpolTs_1;
  PJPDP_sharedPtr jpolTs;
  double discounted_r;
  double v;
  double discounted_F;
  double jt_util;
  double jt_r;
  double jt_prob;
  Index jaI;
  Index jt;
  double r;
  double f;
  LIndex i;
  bool carry_over;
  double newPastReward;
  JointPolicyPureVector bestLBjpolBG;
  double maxLBv;
  stringstream ss;
  JointPolicyPureVector jpolBG;
  stringstream ss_1;
  size_t nrJT;
  LIndex nrJPols;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts;
  Index agI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  double discountToThePowerT;
  BayesianGameForDecPOMDPStage *bg_ts;
  bool is_last_ts;
  size_t ts;
  size_t depth;
  PJPPV_sharedPtr jpolPrevTs;
  Index in_stack_fffffffffffff788;
  Index in_stack_fffffffffffff78c;
  byte bVar24;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffff790;
  JointPolicyPureVector *this_00;
  JointPolicyPureVector *in_stack_fffffffffffff798;
  BayesianGameBase *in_stack_fffffffffffff7a0;
  shared_ptr<PartialJointPolicyDiscretePure> *in_stack_fffffffffffff7a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff7b0;
  Interface_ProblemToPolicyDiscretePure *in_stack_fffffffffffff7b8;
  JointPolicyPureVector *in_stack_fffffffffffff7c0;
  shared_ptr<const_PartialJointPolicyDiscretePure> *in_stack_fffffffffffff808;
  QFunctionJAOHInterface *in_stack_fffffffffffff810;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  BayesianGameForDecPOMDPStage *in_stack_fffffffffffff820;
  string local_620 [32];
  shared_ptr<PartialPolicyPoolItemInterface> local_600;
  undefined1 local_5f0 [16];
  shared_ptr<PartialJointPolicyDiscretePure> local_5e0;
  undefined1 local_5d0 [16];
  shared_ptr<PartialJointPolicyDiscretePure> local_5c0;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  ulong local_598;
  ulong local_590;
  ulong local_588;
  Index local_580;
  uint local_57c;
  double local_578;
  double local_570;
  long local_568;
  bool local_559;
  double local_558;
  undefined1 local_550 [152];
  double local_4b8;
  string local_4b0 [32];
  stringstream local_490 [16];
  ostream local_480 [376];
  undefined1 local_308 [152];
  string local_270 [32];
  stringstream local_250 [16];
  ostream local_240 [376];
  size_t local_c8;
  LIndex local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b8;
  uint local_b0;
  undefined1 local_a8 [24];
  double local_90;
  undefined1 local_82;
  shared_ptr<const_PartialJointPolicyDiscretePure> local_80;
  long *local_70;
  byte local_61;
  size_t local_60;
  size_t local_48;
  shared_ptr<PartialJointPolicyPureVector> local_30;
  shared_ptr<PartialPolicyPoolInterface> *local_18;
  shared_ptr<PartialPolicyPoolItemInterface> *local_10;
  
  auVar20 = in_ZMM1._0_16_;
  *in_RCX = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pPVar4 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(in_RSI);
  (*pPVar4->_vptr_PartialPolicyPoolItemInterface[2])();
  boost::dynamic_pointer_cast<PartialJointPolicyPureVector,PartialJointPolicyDiscretePure>
            (in_stack_fffffffffffff7a8);
  boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<PartialJointPolicyDiscretePure> *)0x96a3a5);
  pPVar5 = boost::shared_ptr<PartialJointPolicyPureVector>::operator->(&local_30);
  sVar6 = JointPolicy::GetDepth((JointPolicy *)pPVar5);
  local_60 = sVar6;
  local_48 = sVar6;
  sVar7 = PlanningUnit::GetHorizon(in_RDI);
  local_61 = sVar6 == sVar7 - 1;
  plVar8 = (long *)operator_new(0x150);
  local_82 = 1;
  boost::shared_ptr<const_PartialJointPolicyDiscretePure>::shared_ptr<PartialJointPolicyPureVector>
            (&local_80,&local_30);
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (in_stack_fffffffffffff820,
             (PlanningUnitDecPOMDPDiscrete *)
             CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),in_stack_fffffffffffff810
             ,in_stack_fffffffffffff808);
  local_82 = 0;
  boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x96a4c4);
  local_70 = plVar8;
  dVar16 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x96a4e1);
  auVar20 = vcvtusi2sd_avx512f(auVar20,local_60);
  local_90 = pow(dVar16,auVar20._0_8_);
  (*in_RDI->_vptr_PlanningUnit[6])();
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x96a53e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffff7b0,(size_type)in_stack_fffffffffffff7a8,
             (allocator_type *)in_stack_fffffffffffff7a0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x96a56a);
  for (local_b0 = 0; uVar9 = (ulong)local_b0, iVar2 = (*in_RDI->_vptr_PlanningUnit[6])(),
      uVar9 < CONCAT44(extraout_var,iVar2); local_b0 = local_b0 + 1) {
    i_00 = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                     (in_stack_fffffffffffff790,in_stack_fffffffffffff78c,in_stack_fffffffffffff788)
    ;
    IVar3 = Globals::CastLIndexToIndex(i_00);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffff790,
                         CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
    *pvVar10 = IVar3;
  }
  local_b8 = BayesianGameBase::GetNrTypes((BayesianGameBase *)(local_70 + 4));
  local_c0 = BayesianGameBase::GetNrJointPolicies((BayesianGameBase *)0x96a712);
  local_c8 = BayesianGameBase::GetNrJointTypes(in_stack_fffffffffffff7a0);
  in_RDI[0x17]._m_horizon = in_RDI[0x17]._m_horizon + 1;
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff790,
                          (char *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_250);
    poVar11 = std::operator<<(local_240,(string *)&in_RDI[0x17]._m_seed);
    std::ostream::operator<<(poVar11,in_RDI[0x17]._m_horizon);
    std::__cxx11::stringstream::str();
    BayesianGameIdenticalPayoff::Save
              ((BayesianGameIdenticalPayoff *)in_stack_fffffffffffff790,
               (string *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
    std::__cxx11::string::~string(local_270);
    std::__cxx11::stringstream::~stringstream(local_250);
  }
  JointPolicyPureVector::JointPolicyPureVector(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  if (2 < *(int *)&in_RDI[0x16]._m_problem) {
    poVar11 = std::operator<<((ostream *)&std::cout,"starting on solution of BG for t=");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_60);
    poVar11 = std::operator<<(poVar11," with nrJPols=");
    pvVar12 = (void *)std::ostream::operator<<(poVar11,local_c0);
    std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::stringstream(local_490);
  poVar11 = std::operator<<(local_480,"GMAA::NextExact_ts");
  std::ostream::operator<<(poVar11,local_60);
  std::__cxx11::stringstream::str();
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffff790,
             (string *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
  std::__cxx11::string::~string(local_4b0);
  local_4b8 = -1.79769313486232e+308;
  JointPolicyPureVector::JointPolicyPureVector(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  local_558 = 0.0;
  (**(code **)(*local_70 + 0x18))(local_70,0);
  local_559 = false;
  local_568 = 0;
  do {
    if (((local_559 ^ 0xffU) & 1) == 0) {
LAB_0096b163:
      (**(code **)(*local_70 + 0x20))();
      if ((local_61 & 1) != 0) {
        pPVar13 = boost::shared_ptr<PartialJointPolicyPureVector>::operator*(&local_30);
        (*in_RDI->_vptr_PlanningUnit[0x18])(&local_5e0,in_RDI,pPVar13,local_550,local_b8,local_a8);
        pPVar14 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_5e0);
        PartialJointPolicy::SetPastReward(&pPVar14->super_PartialJointPolicy,local_558);
        pPVar15 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_18);
        (*in_RDI->_vptr_PlanningUnit[0x16])(local_4b8,local_5f0,in_RDI,&local_5e0);
        (*pPVar15->_vptr_PartialPolicyPoolInterface[8])(pPVar15,local_5f0);
        boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                  ((shared_ptr<PartialPolicyPoolItemInterface> *)0x96b274);
        boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
                  ((shared_ptr<PartialJointPolicyDiscretePure> *)0x96b281);
      }
      if (1 < *(int *)&in_RDI[0x16]._m_problem) {
        poVar11 = std::operator<<((ostream *)&std::cout,"Solved BG for t=");
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_60);
        poVar11 = std::operator<<(poVar11,". Max. expected value (including ");
        poVar11 = std::operator<<(poVar11,"true expected reward up to this ts:");
        pPVar5 = boost::shared_ptr<PartialJointPolicyPureVector>::operator->(&local_30);
        dVar16 = PartialJointPolicy::GetPastReward
                           (&(pPVar5->super_PartialJointPolicyDiscretePure).super_PartialJointPolicy
                           );
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,dVar16);
        dVar16 = extraout_XMM0_Qa_00;
        poVar11 = std::operator<<(poVar11,") is:");
        pPVar15 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_18);
        (*pPVar15->_vptr_PartialPolicyPoolInterface[4])(&local_600);
        pPVar4 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(&local_600);
        (*pPVar4->_vptr_PartialPolicyPoolItemInterface[3])();
        in_stack_fffffffffffff7a0 = (BayesianGameBase *)std::ostream::operator<<(poVar11,dVar16);
        std::ostream::operator<<(in_stack_fffffffffffff7a0,std::endl<char,std::char_traits<char>>);
        boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                  ((shared_ptr<PartialPolicyPoolItemInterface> *)0x96b42a);
      }
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      this_00 = (JointPolicyPureVector *)&in_RDI[0x14]._m_horizon;
      std::__cxx11::stringstream::str();
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)this_00,
                 (string *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
      std::__cxx11::string::~string(local_620);
      bVar24 = local_61;
      JointPolicyPureVector::~JointPolicyPureVector(this_00);
      std::__cxx11::stringstream::~stringstream(local_490);
      JointPolicyPureVector::~JointPolicyPureVector(this_00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff7a0);
      boost::shared_ptr<PartialJointPolicyPureVector>::~shared_ptr
                ((shared_ptr<PartialJointPolicyPureVector> *)0x96b507);
      return (bool)(bVar24 & 1);
    }
    if (-1 < *(int *)&in_RDI[0x16]._m_problem) {
      local_568 = local_568 + 1;
      PrintTools::PrintProgress<char_const*>
                ((char *)in_stack_fffffffffffff7c0,(LIndex)in_stack_fffffffffffff7b8,
                 (LIndex)in_stack_fffffffffffff7b0,(size_t)in_stack_fffffffffffff7a8);
    }
    local_570 = 0.0;
    local_578 = 0.0;
    for (local_57c = 0; local_57c < local_c8; local_57c = local_57c + 1) {
      local_580 = JointPolicyPureVector::GetJointActionIndex
                            ((JointPolicyPureVector *)in_stack_fffffffffffff790,
                             in_stack_fffffffffffff78c);
      local_588 = (**(code **)(local_70[4] + 0x68))(local_70 + 4,local_57c);
      auVar18._0_8_ = (**(code **)(*local_70 + 0x10))(local_70,local_57c,local_580,0);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_588;
      auVar18._8_8_ = 0;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_578;
      auVar20 = vfmadd213sd_fma(auVar18,auVar20,auVar22);
      local_578 = auVar20._0_8_;
      local_590 = auVar18._0_8_;
      auVar19._0_8_ = (**(code **)(local_70[4] + 0x80))(local_70 + 4,local_57c,local_580);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_588;
      auVar19._8_8_ = 0;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_570;
      auVar20 = vfmadd213sd_fma(auVar19,auVar21,auVar23);
      local_570 = auVar20._0_8_;
      local_598 = auVar19._0_8_;
    }
    local_5a0 = local_90 * local_570;
    pPVar5 = boost::shared_ptr<PartialJointPolicyPureVector>::operator->(&local_30);
    local_5a8 = PartialJointPolicy::GetPastReward
                          (&(pPVar5->super_PartialJointPolicyDiscretePure).super_PartialJointPolicy)
    ;
    local_5a8 = local_5a8 + local_5a0;
    local_5b0 = local_90 * local_578;
    pPVar5 = boost::shared_ptr<PartialJointPolicyPureVector>::operator->(&local_30);
    local_558 = PartialJointPolicy::GetPastReward
                          (&(pPVar5->super_PartialJointPolicyDiscretePure).super_PartialJointPolicy)
    ;
    local_558 = local_558 + local_5b0;
    if ((local_61 & 1) == 0) {
      pPVar13 = boost::shared_ptr<PartialJointPolicyPureVector>::operator*(&local_30);
      (*in_RDI->_vptr_PlanningUnit[0x18])(&local_5c0,in_RDI,pPVar13,local_308,local_b8,local_a8);
      pPVar14 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_5c0);
      PartialJointPolicy::SetPastReward(&pPVar14->super_PartialJointPolicy,local_558);
      pPVar15 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_18);
      (*in_RDI->_vptr_PlanningUnit[0x16])(local_5d0,in_RDI,&local_5c0);
      (*pPVar15->_vptr_PartialPolicyPoolInterface[8])(pPVar15,local_5d0);
      boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
                ((shared_ptr<PartialPolicyPoolItemInterface> *)0x96aeeb);
      boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
                ((shared_ptr<PartialJointPolicyDiscretePure> *)0x96aef8);
    }
    else {
      local_5a8 = local_558;
      if (local_4b8 < local_558) {
        JointPolicyPureVector::operator=
                  (in_stack_fffffffffffff798,(JointPolicyPureVector *)in_stack_fffffffffffff790);
        local_4b8 = local_5a8;
      }
      dVar16 = local_5a8;
      dVar17 = local_5a8;
      pPVar4 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
      (*pPVar4->_vptr_PartialPolicyPoolItemInterface[3])();
      if (dVar17 - 1e-08 <= dVar16) {
        if (-1 < *(int *)&in_RDI[0x16]._m_problem) {
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "GMAA_MAAstarClassic::ConstructAndValuateNextPolicies");
          poVar11 = std::operator<<(poVar11," Last time step, found tight bound: ");
          poVar11 = std::operator<<(poVar11,"found value v=");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_5a8);
          dVar16 = extraout_XMM0_Qa;
          poVar11 = std::operator<<(poVar11,", parent (upperbound) value=");
          pPVar4 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
          (*pPVar4->_vptr_PartialPolicyPoolItemInterface[3])();
          pvVar12 = (void *)std::ostream::operator<<(poVar11,dVar16);
          std::ostream::operator<<(pvVar12,std::endl<char,std::char_traits<char>>);
        }
        goto LAB_0096b163;
      }
    }
    local_559 = JointPolicyPureVector::operator++((JointPolicyPureVector *)0x96b12a);
    in_RDI[0x18]._m_horizon = in_RDI[0x18]._m_horizon + 1;
  } while( true );
}

Assistant:

bool GMAA_MAAstarClassic::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    cleanUpPPI=true;
    //return(ConstructAndValuateNextPoliciesExactBG( ppi, poolOfNextPolicies));
    //moved this function here since MAA* is the only GMAA variant that does it
    //in this way...
    PJPPV_sharedPtr jpolPrevTs = 
        boost::dynamic_pointer_cast<PartialJointPolicyPureVector >(ppi->GetJPol());//jpol^ts-1
    size_t depth = jpolPrevTs->GetDepth(); // = depth = ts(jpolPrevTs) + 1
    size_t ts = depth; //jpol = jpol^ts-1, we construct BG for ts == depth
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    // Construct the bayesian game for this timestep - 
    BayesianGameForDecPOMDPStage *bg_ts= new BayesianGameForDecPOMDPStage(
            this,
            _m_qHeuristic,
            jpolPrevTs
            );

    double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
    vector<Index> firstOHtsI(GetNrAgents());
    for(Index agI=0; agI < GetNrAgents(); agI++)
        firstOHtsI.at(agI) = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
    const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
    LIndex nrJPols = bg_ts->GetNrJointPolicies();
    size_t nrJT = bg_ts->GetNrJointTypes();

    _m_bgCounter++;
    if(_m_bgBaseFilename!="")
    {
        stringstream ss;
        ss << _m_bgBaseFilename << _m_bgCounter;
        BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
    }

#if DEBUG_GMAA3
    if(_m_verboseness >= 3) {
        cout << "Constructed BG:"<<endl;
        bg_ts->Print();
    }
#endif


    //the policy for the Bayesian game 
    JointPolicyPureVector jpolBG = JointPolicyPureVector(bg_ts);

    if(_m_verboseness >= 3) 
        cout << "starting on solution of BG for t="<<ts<<" with nrJPols="
            <<nrJPols<<endl;

    stringstream ss;
    ss << "GMAA::NextExact_ts" << ts;
    StartTimer(ss.str());

    //some variables used when this is the last time-step
    double maxLBv = -DBL_MAX;
    JointPolicyPureVector bestLBjpolBG = JointPolicyPureVector(bg_ts);
    double newPastReward = 0.0;
    //we cache the immediate rewards in the BG...
    bg_ts->ComputeAllImmediateRewards();

    /* Do the full enumeration of all joint policies for the BG...*/
    bool carry_over = false;
    LIndex i = 0;
    while(!carry_over)
    {
        if(_m_verboseness >= 0)
            PrintProgress("BG joint policy", i++, nrJPols, 10000);
        //eval the expected future payoff of this jpolBG
        double f = 0.0;        
        double r = 0.0; //immediate reward (exact)
        for(Index jt = 0; jt < nrJT ; jt++)
        {
            Index jaI = jpolBG.GetJointActionIndex(jt);
            double jt_prob = bg_ts->GetProbability(jt);
            double jt_r = bg_ts->GetImmediateReward(jt, jaI);
            r += jt_prob * jt_r;
            double jt_util = bg_ts->GetUtility(jt, jaI);
            f += jt_prob * jt_util;
        }
        //add the expected reward for 0...ts-1
        //NOTE the expected reward has been computed as
        //f = R + gamma * F
        //by the heuristic. That means that f itself is not yet
        //discounted!!:
        double discounted_F = discountToThePowerT * f;
        double v = jpolPrevTs->GetPastReward() + discounted_F;
        // the new past reward:
        double discounted_r = discountToThePowerT * r;

#if DEBUG_GMAA4
        cout <<"v = pastReward_prevTs + g^t * f = "
                << v <<" = "
                << jpolPrevTs->GetPastReward() <<" + "
                << discounted_F << "   "
                << "(g^t * f ="<<discountToThePowerT << " * " << f << ")"
                << endl;
#endif

        newPastReward = jpolPrevTs->GetPastReward() + discounted_r;
        if(!is_last_ts) 
        {   
            //not the last time step...construct and return all 
            //partial DecPOMDP policies,
            
            // construct a policy for the DecPOMDP: a copy of jpolPrevTs
            // extended to this time step (ts) by jpolBG
            PJPDP_sharedPtr jpolTs = 
                ConstructExtendedJointPolicy(*jpolPrevTs,
                    jpolBG, nrOHts, firstOHtsI);
            jpolTs->SetPastReward(newPastReward);

            // wrap the policy and put it in the pool of next policies.
            // (these next policies are candidates to be added to the 
            // main policy pool)
            // Warning: jpolTs may have been deleted afterwards
            poolOfNextPolicies->Insert( NewPPI(jpolTs, v) );

            // conserve memory 
            // is this necessary?  - this is performed by 
            //      'SelectPoliciesToProcessFurther' 
            // seems like duplicate work...
            //if(poolOfNextPolicies->Size()>(_m_nrPoliciesToProcess*10))
                //Prune(poolOfNextPolicies,_m_nrPoliciesToProcess);
        }
        else
        {   
            //if using a heuristic that does not specify the exact immediate
            //reward, we still want to return the *EXACT* payoff here...
            v = newPastReward;
            //this is the last time step: 
            //  -values are lowerbounds, so if we find a policy with total 
            //      reward equal to the upperbound of the parent (ppi->
            //      GetValue() ) then we can stop evaluating other policies.
            //  -we will only need to return 1 policy and value
            //   (so we do not put them in a pool)
            if(v > maxLBv)
            {
                bestLBjpolBG = jpolBG;
                maxLBv = v;
            }
            if(v >= ppi->GetValue() - 1e-8)
            {
                if(_m_verboseness >= 0) 
                    cout << "GMAA_MAAstarClassic::ConstructAndValuateNextPolicies"<<
                        " Last time step, found tight bound: "<<
                        "found value v="<<v<<", parent (upperbound) value="<<
                        ppi->GetValue() << endl;
                break;
            }
        }
        carry_over = ++jpolBG; //next policy for the BG...
        _m_nrJPolBGsEvaluated++;
    }
    //empty the imm reward cache
    bg_ts->ClearAllImmediateRewards();

    //if this is the last time step, we have not constructed the Dec-POMDP
    //policy which will be returned yet, so we do this now:
    if(is_last_ts) 
    {
        PJPDP_sharedPtr jpolTs = ConstructExtendedJointPolicy(
                *jpolPrevTs,
                bestLBjpolBG, 
                nrOHts, 
                firstOHtsI
                );
        jpolTs->SetPastReward(newPastReward);
        // Warning: jpolTs may have been deleted afterwards
        poolOfNextPolicies->Insert( NewPPI(jpolTs, maxLBv ) );
    }

    if(_m_verboseness >= 2) 
        cout <<"Solved BG for t="<<ts<<". Max. expected value (including "
             <<"true expected reward up to this ts:"<<jpolPrevTs->GetPastReward()<<") is:"
             <<poolOfNextPolicies->Select()->GetValue() <<endl;

    delete(bg_ts);
    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);

}